

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_d38b9::KeywordsSink::put
          (KeywordsSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *errorCode)

{
  UList *list;
  UBool UVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  undefined7 in_register_00000009;
  int i;
  char *key_local;
  UErrorCode *local_e0;
  CharString defcoll;
  UnicodeString local_98;
  ResourceTable collations;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    key_local = key;
    (*(value->super_UObject)._vptr_UObject[0xb])
              (&collations,value,errorCode,CONCAT71(in_register_00000009,param_3));
    i = 0;
    local_e0 = errorCode;
    do {
      UVar1 = icu_63::ResourceTable::getKeyAndValue(&collations,i,&key_local,value);
      if (UVar1 == '\0') {
        return;
      }
      iVar2 = (*(value->super_UObject)._vptr_UObject[3])(value);
      pcVar3 = key_local;
      if (iVar2 == 2) {
        iVar2 = strncmp(key_local,"private-",8);
        if (iVar2 != 0) {
          list = this->values;
          sVar4 = strlen(pcVar3);
          errorCode = local_e0;
          UVar1 = ulist_containsString_63(list,pcVar3,(int32_t)sVar4);
          if (UVar1 == '\0') {
            ulist_addItemEndList_63(this->values,key_local,'\0',errorCode);
          }
        }
      }
      else if (((iVar2 == 0) && (this->hasDefault == '\0')) &&
              (iVar2 = strcmp(key_local,"default"), iVar2 == 0)) {
        icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&defcoll.buffer);
        defcoll.len = 0;
        *defcoll.buffer.ptr = '\0';
        icu_63::ResourceValue::getUnicodeString(&local_98,value,errorCode);
        icu_63::CharString::appendInvariantChars(&defcoll,&local_98,errorCode);
        icu_63::UnicodeString::~UnicodeString(&local_98);
        if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) && (defcoll.len != 0)) {
          pcVar3 = uprv_strdup_63(defcoll.buffer.ptr);
          if (pcVar3 == (char *)0x0) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
            icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&defcoll.buffer);
            return;
          }
          ulist_removeString_63(this->values,defcoll.buffer.ptr);
          ulist_addItemBeginList_63(this->values,pcVar3,'\x01',errorCode);
          this->hasDefault = '\x01';
        }
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&defcoll.buffer);
      }
      i = i + 1;
    } while (*errorCode < U_ILLEGAL_ARGUMENT_ERROR);
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
                     UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) { return; }
        ResourceTable collations = value.getTable(errorCode);
        for (int32_t i = 0; collations.getKeyAndValue(i, key, value); ++i) {
            UResType type = value.getType();
            if (type == URES_STRING) {
                if (!hasDefault && uprv_strcmp(key, "default") == 0) {
                    CharString defcoll;
                    defcoll.appendInvariantChars(value.getUnicodeString(errorCode), errorCode);
                    if (U_SUCCESS(errorCode) && !defcoll.isEmpty()) {
                        char *ownedDefault = uprv_strdup(defcoll.data());
                        if (ownedDefault == NULL) {
                            errorCode = U_MEMORY_ALLOCATION_ERROR;
                            return;
                        }
                        ulist_removeString(values, defcoll.data());
                        ulist_addItemBeginList(values, ownedDefault, TRUE, &errorCode);
                        hasDefault = TRUE;
                    }
                }
            } else if (type == URES_TABLE && uprv_strncmp(key, "private-", 8) != 0) {
                if (!ulist_containsString(values, key, (int32_t)uprv_strlen(key))) {
                    ulist_addItemEndList(values, key, FALSE, &errorCode);
                }
            }
            if (U_FAILURE(errorCode)) { return; }
        }
    }